

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O2

int mpt::type_properties<mpt::span<mpt::metatype::value<double>_*const>_>::id(bool obtain)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  type_traits *ptVar4;
  
  if (id::_valtype < 1) {
    iVar2 = type_properties<mpt::metatype::value<double>_*>::id(false);
    uVar3 = iVar2 + 0xe0U & 0xff;
    uVar1 = uVar3;
    if (iVar2 - 0x7bU < 0xffffffe5 || uVar3 == 0) {
      if (obtain) {
        ptVar4 = _dynamic_traits();
        uVar3 = mpt::type_traits::add(ptVar4);
        uVar1 = uVar3;
      }
      else {
        uVar3 = 0xfffffffd;
        uVar1 = id::_valtype;
      }
    }
    id::_valtype = uVar1;
    return uVar3;
  }
  return id::_valtype;
}

Assistant:

static int id(bool obtain = false) {
		static int _valtype = 0;
		if (_valtype > 0) {
			return _valtype;
		}
		/* use vector IDs for builtin types */
		int type = type_properties<T>::id(false);
		if ((type = MPT_type_toVector(type)) > 0) {
			return _valtype = type;
		}
		if (!obtain) {
			return BadType;
		}
		return _valtype = type_traits::add(*_dynamic_traits());
	}